

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int __thiscall
cppcms::crypto::openssl_aes_encryptor::decrypt
          (openssl_aes_encryptor *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,
          size_t inlen)

{
  int extraout_EAX;
  uchar *userKey;
  
  check(this);
  if (this->decryption_initialized_ == false) {
    userKey = (uchar *)crypto::key::data(&this->key_);
    AES_set_decrypt_key(userKey,this->type_,(AES_KEY *)&this->key_dec_);
    this->decryption_initialized_ = true;
  }
  AES_cbc_encrypt((uchar *)ctx,out,(ulong)outlen & 0xffffffff,(AES_KEY *)&this->key_dec_,
                  this->iv_dec_,0);
  return extraout_EAX;
}

Assistant:

virtual void decrypt(void const *in,void *out,unsigned len)
		{
			check();
			if(!decryption_initialized_) {
				AES_set_decrypt_key(reinterpret_cast<unsigned char const *>(key_.data()), type_, &key_dec_);
				decryption_initialized_ = true;
			}

			AES_cbc_encrypt(reinterpret_cast<unsigned char const *>(in),
					reinterpret_cast<unsigned char *>(out), len,
					&key_dec_,
					iv_dec_,
					AES_DECRYPT);
		}